

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::unwind_to(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *this,sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *ptr)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  chunk *pcVar3;
  
  psVar2 = this->begin_;
  if ((ptr < psVar2) || (this->end_ <= ptr)) {
    pcVar3 = this->current_chunk_;
    do {
      pcVar3->curr_ = psVar2;
      pcVar3 = pcVar3->back_;
      psVar2 = pcVar3->begin_;
    } while (pcVar3->end_ <= ptr || ptr < psVar2);
    psVar1 = pcVar3->curr_;
    this->end_ = pcVar3->end_;
    this->current_chunk_ = pcVar3;
    this->begin_ = psVar2;
    this->curr_ = psVar1;
  }
  this->curr_ = ptr;
  this->current_chunk_->curr_ = ptr;
  return;
}

Assistant:

void unwind_to(T *ptr)
    {
        while(!this->in_current_chunk(ptr))
        {
            // completely unwind the current chunk, move to the previous chunk
            this->unwind_chunk_();
        }
        this->current_chunk_->curr_ = this->curr_ = ptr;
    }